

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O2

tommy_uint32_t tommy_hash_u32(tommy_uint32_t init_val,void *void_key,tommy_size_t key_len)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  uVar2 = init_val + (int)key_len + 0xdeadbeef;
  uVar6 = uVar2;
  uVar4 = uVar2;
LAB_0010e0c2:
  switch(key_len) {
  case 0:
switchD_0010e140_caseD_0:
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
      __stack_chk_fail();
    }
    return uVar2;
  case 1:
    goto switchD_0010e140_caseD_1;
  case 2:
    goto switchD_0010e140_caseD_2;
  case 3:
    uVar4 = uVar4 + (uint)*(byte *)((long)void_key + 2) * 0x10000;
    goto switchD_0010e140_caseD_2;
  case 4:
    goto switchD_0010e140_caseD_4;
  case 5:
    goto switchD_0010e140_caseD_5;
  case 6:
    goto switchD_0010e140_caseD_6;
  case 7:
    uVar6 = uVar6 + (uint)*(byte *)((long)void_key + 6) * 0x10000;
    goto switchD_0010e140_caseD_6;
  case 8:
    break;
  case 9:
    goto switchD_0010e140_caseD_9;
  case 10:
    goto switchD_0010e140_caseD_a;
  case 0xb:
    uVar2 = uVar2 + (uint)*(byte *)((long)void_key + 10) * 0x10000;
    goto switchD_0010e140_caseD_a;
  case 0xc:
    uVar2 = uVar2 + *(int *)((long)void_key + 8);
    break;
  default:
    goto switchD_0010e140_default;
  }
switchD_0010e140_caseD_8:
  uVar6 = uVar6 + *(int *)((long)void_key + 4);
switchD_0010e140_caseD_4:
  uVar4 = uVar4 + *void_key;
LAB_0010e197:
  uVar2 = (uVar2 ^ uVar6) - (uVar6 << 0xe | uVar6 >> 0x12);
  uVar3 = (uVar4 ^ uVar2) - (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar4 = (uVar6 ^ uVar3) - (uVar3 * 0x2000000 | uVar3 >> 7);
  uVar6 = (uVar2 ^ uVar4) - (uVar4 * 0x10000 | uVar4 >> 0x10);
  uVar2 = (uVar3 ^ uVar6) - (uVar6 * 0x10 | uVar6 >> 0x1c);
  uVar4 = (uVar4 ^ uVar2) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar2 = (uVar6 ^ uVar4) - (uVar4 * 0x1000000 | uVar4 >> 8);
  goto switchD_0010e140_caseD_0;
switchD_0010e140_default:
  uVar2 = uVar2 + *(int *)((long)void_key + 8);
  uVar4 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar4 + *void_key) - uVar2;
  iVar1 = uVar2 + uVar6 + *(int *)((long)void_key + 4);
  uVar6 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar6 + *(int *)((long)void_key + 4)) - uVar4;
  iVar5 = uVar4 + iVar1;
  uVar2 = (uVar6 << 8 | uVar6 >> 0x18) ^ iVar1 - uVar6;
  iVar1 = uVar6 + iVar5;
  uVar4 = (uVar2 << 0x10 | uVar2 >> 0x10) ^ iVar5 - uVar2;
  iVar5 = uVar2 + iVar1;
  uVar6 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar1 - uVar4;
  uVar4 = uVar4 + iVar5;
  uVar2 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar5 - uVar6;
  uVar6 = uVar6 + uVar4;
  key_len = key_len - 0xc;
  void_key = (void *)((long)void_key + 0xc);
  goto LAB_0010e0c2;
switchD_0010e140_caseD_a:
  uVar2 = uVar2 + (uint)*(byte *)((long)void_key + 9) * 0x100;
switchD_0010e140_caseD_9:
  uVar2 = uVar2 + *(byte *)((long)void_key + 8);
  goto switchD_0010e140_caseD_8;
switchD_0010e140_caseD_6:
  uVar6 = uVar6 + (uint)*(byte *)((long)void_key + 5) * 0x100;
switchD_0010e140_caseD_5:
  uVar6 = uVar6 + *(byte *)((long)void_key + 4);
  goto switchD_0010e140_caseD_4;
switchD_0010e140_caseD_2:
  uVar4 = uVar4 + (uint)*(byte *)((long)void_key + 1) * 0x100;
switchD_0010e140_caseD_1:
  uVar4 = uVar4 + *void_key;
  goto LAB_0010e197;
}

Assistant:

tommy_uint32_t tommy_hash_u32(tommy_uint32_t init_val, const void* void_key, tommy_size_t key_len)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;

	a = b = c = 0xdeadbeef + ((tommy_uint32_t)key_len) + init_val;

	while (key_len > 12) {
		a += tommy_le_uint32_read(key + 0);
		b += tommy_le_uint32_read(key + 4);
		c += tommy_le_uint32_read(key + 8);

		tommy_mix(a, b, c);

		key_len -= 12;
		key += 12;
	}

	switch (key_len) {
	case 0 :
		return c; /* used only when called with a zero length */
	case 12 :
		c += tommy_le_uint32_read(key + 8);
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 11 : c += ((tommy_uint32_t)key[10]) << 16; /* fallthrough */
	case 10 : c += ((tommy_uint32_t)key[9]) << 8; /* fallthrough */
	case 9 : c += key[8]; /* fallthrough */
	case 8 :
		b += tommy_le_uint32_read(key + 4);
		a += tommy_le_uint32_read(key + 0);
		break;
	case 7 : b += ((tommy_uint32_t)key[6]) << 16; /* fallthrough */
	case 6 : b += ((tommy_uint32_t)key[5]) << 8; /* fallthrough */
	case 5 : b += key[4]; /* fallthrough */
	case 4 :
		a += tommy_le_uint32_read(key + 0);
		break;
	case 3 : a += ((tommy_uint32_t)key[2]) << 16; /* fallthrough */
	case 2 : a += ((tommy_uint32_t)key[1]) << 8; /* fallthrough */
	case 1 : a += key[0]; /* fallthrough */
	}

	tommy_final(a, b, c);

	return c;
}